

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hokuyo.h
# Opt level: O2

int DisconnectHokuyo(HOKUYO *pHokuyo)

{
  int iVar1;
  size_t sVar2;
  uint8 local_14 [4];
  
  sVar2 = strlen((char *)local_14);
  iVar1 = WriteAllRS232Port(&pHokuyo->RS232Port,local_14,(int)sVar2);
  if (iVar1 == 0) {
    iVar1 = CloseRS232Port(&pHokuyo->RS232Port);
    if (iVar1 == 0) {
      puts("Hokuyo disconnected.");
      return 0;
    }
    puts("Hokuyo disconnection failed.");
  }
  else {
    puts("Error while disconnecting a Hokuyo.");
    CloseRS232Port(&pHokuyo->RS232Port);
  }
  return 1;
}

Assistant:

inline int DisconnectHokuyo(HOKUYO* pHokuyo)
{		
	char sendbuf[4];
	int sendbuflen = 0;
	//char recvbuf[9];
	//int recvbuflen = 0;

	// QT command to switch off the laser.

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	strcpy(sendbuf, "QT\n");
	sendbuflen = (int)strlen(sendbuf);

	if (WriteAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		printf("Error while disconnecting a Hokuyo.\n");
		CloseRS232Port(&pHokuyo->RS232Port);
		return EXIT_FAILURE;
	}
	
	//// Prepare the buffers.
	//memset(recvbuf, 0, sizeof(recvbuf));
	//recvbuflen = 8;

	//if (ReadAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	//{
	//	printf("Error while disconnecting a Hokuyo.\n");
	//	CloseRS232Port(&pHokuyo->RS232Port);
	//	return EXIT_FAILURE;
	//}

	//// Check response.
	//if (strcmp(recvbuf, "QT\n00P\n\n") != 0)
	//{
	//	printf("Error while disconnecting a Hokuyo.\n");
	//	CloseRS232Port(&pHokuyo->RS232Port);
	//	return EXIT_FAILURE;
	//}

	if (CloseRS232Port(&pHokuyo->RS232Port) != EXIT_SUCCESS)
	{
		printf("Hokuyo disconnection failed.\n");
		return EXIT_FAILURE;
	}

	printf("Hokuyo disconnected.\n");

	return EXIT_SUCCESS;
}